

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

TypedDeleter<LLVMBC::BasicBlock> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::BasicBlock>,LLVMBC::BasicBlock*&>
          (LLVMContext *this,BasicBlock **u)

{
  BasicBlock *pBVar1;
  TypedDeleter<LLVMBC::BasicBlock> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::BasicBlock> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::BasicBlock> *)0x0) {
    pBVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001f8480;
    pTVar2->ptr = pBVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}